

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddConvexPolyFilled
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool anti_aliased)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ImVec2 IVar3;
  float fVar4;
  long lVar5;
  ImDrawIdx IVar6;
  undefined4 in_EAX;
  ulong uVar7;
  ImDrawIdx *pIVar8;
  int iVar9;
  ImDrawVert *pIVar10;
  int iVar11;
  ImDrawIdx IVar12;
  uint uVar13;
  ImDrawIdx IVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  ImVec2 IVar22;
  ImVec2 IVar23;
  undefined4 uStack_38;
  uint local_34;
  
  IVar3 = GImGui->FontTexUvWhitePixel;
  if ((GImGui->Style).AntiAliasedShapes != false && anti_aliased) {
    _uStack_38 = CONCAT44(points_count * 2,in_EAX);
    PrimReserve(this,points_count * 9 + -6,points_count * 2);
    uVar15 = this->_VtxCurrentIdx;
    IVar6 = (ImDrawIdx)uVar15;
    if (2 < points_count) {
      pIVar8 = this->_IdxWritePtr;
      iVar9 = points_count + -2;
      iVar11 = uVar15 + 2;
      do {
        *pIVar8 = IVar6;
        pIVar8[1] = (ImDrawIdx)iVar11;
        iVar11 = iVar11 + 2;
        pIVar8[2] = (ImDrawIdx)iVar11;
        pIVar8 = pIVar8 + 3;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      this->_IdxWritePtr = pIVar8;
    }
    lVar5 = -0x38 - ((long)points_count * 8 + 0xfU & 0xfffffffffffffff0);
    if (0 < points_count) {
      uVar13 = points_count - 1;
      uVar7 = 0;
      uVar16 = (ulong)uVar13;
      do {
        lVar17 = (long)(int)uVar16;
        fVar19 = points[uVar7].x - points[lVar17].x;
        fVar20 = points[uVar7].y - points[lVar17].y;
        fVar21 = fVar19 * fVar19 + fVar20 * fVar20;
        uVar18 = -(uint)(0.0 < fVar21);
        fVar21 = (float)(~uVar18 & 0x3f800000 | (uint)(1.0 / SQRT(fVar21)) & uVar18);
        *(ulong *)((long)&uStack_38 + lVar17 * 8 + lVar5 + 0x38) =
             CONCAT44(fVar21 * -fVar19,fVar21 * fVar20);
        uVar16 = uVar7 & 0xffffffff;
        uVar7 = uVar7 + 1;
      } while ((uint)points_count != uVar7);
      if (0 < points_count) {
        uVar7 = 0;
        do {
          uVar1 = *(undefined8 *)((long)&uStack_38 + (long)(int)uVar13 * 8 + lVar5 + 0x38);
          uVar2 = *(undefined8 *)((long)&uStack_38 + uVar7 * 8 + lVar5 + 0x38);
          fVar21 = ((float)uVar2 + (float)uVar1) * 0.5;
          fVar19 = ((float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20)) * 0.5;
          fVar20 = fVar21 * fVar21 + fVar19 * fVar19;
          if (1e-06 < fVar20) {
            fVar20 = 1.0 / fVar20;
            fVar4 = 100.0;
            if (fVar20 <= 100.0) {
              fVar4 = fVar20;
            }
            fVar21 = fVar21 * fVar4;
            fVar19 = fVar19 * fVar4;
          }
          IVar22.x = points[uVar7].x - fVar21 * 0.5;
          IVar22.y = points[uVar7].y - fVar19 * 0.5;
          this->_VtxWritePtr->pos = IVar22;
          this->_VtxWritePtr->uv = IVar3;
          pIVar10 = this->_VtxWritePtr;
          pIVar10->col = col;
          IVar23.x = points[uVar7].x + fVar21 * 0.5;
          IVar23.y = points[uVar7].y + fVar19 * 0.5;
          pIVar10[1].pos = IVar23;
          this->_VtxWritePtr[1].uv = IVar3;
          pIVar10 = this->_VtxWritePtr;
          pIVar10[1].col = col & 0xffffff;
          this->_VtxWritePtr = pIVar10 + 2;
          pIVar8 = this->_IdxWritePtr;
          IVar14 = (ImDrawIdx)uVar15;
          *pIVar8 = IVar14;
          pIVar8[1] = IVar6 + (short)uVar13 * 2;
          IVar12 = IVar6 + 1 + (short)uVar13 * 2;
          pIVar8[2] = IVar12;
          pIVar8[3] = IVar12;
          pIVar8[4] = IVar14 + 1;
          pIVar8[5] = IVar14;
          this->_IdxWritePtr = pIVar8 + 6;
          uVar13 = (uint)uVar7;
          uVar7 = uVar7 + 1;
          uVar15 = uVar15 + 2;
        } while ((uint)points_count != uVar7);
        uVar15 = this->_VtxCurrentIdx;
      }
    }
    local_34 = local_34 & 0xfffe;
    goto LAB_00184561;
  }
  PrimReserve(this,points_count * 3 + -6,points_count);
  if (points_count < 1) {
LAB_0018455a:
    uVar15 = this->_VtxCurrentIdx;
  }
  else {
    pIVar10 = this->_VtxWritePtr;
    uVar7 = 0;
    do {
      pIVar10->pos = points[uVar7];
      this->_VtxWritePtr->uv = IVar3;
      pIVar10 = this->_VtxWritePtr;
      pIVar10->col = col;
      pIVar10 = pIVar10 + 1;
      this->_VtxWritePtr = pIVar10;
      uVar7 = uVar7 + 1;
    } while ((uint)points_count != uVar7);
    if (points_count < 3) goto LAB_0018455a;
    uVar15 = this->_VtxCurrentIdx;
    pIVar8 = this->_IdxWritePtr;
    iVar9 = points_count + -2;
    iVar11 = uVar15 + 2;
    do {
      *pIVar8 = (ImDrawIdx)uVar15;
      pIVar8[1] = (ImDrawIdx)iVar11 - 1;
      pIVar8[2] = (ImDrawIdx)iVar11;
      pIVar8 = pIVar8 + 3;
      iVar11 = iVar11 + 1;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    this->_IdxWritePtr = pIVar8;
  }
  local_34 = points_count & 0xffff;
LAB_00184561:
  this->_VtxCurrentIdx = local_34 + uVar15;
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col, bool anti_aliased)
{
    const ImVec2 uv = GImGui->FontTexUvWhitePixel;
    anti_aliased &= GImGui->Style.AntiAliasedShapes;
    //if (ImGui::GetIO().KeyCtrl) anti_aliased = false; // Debug

    if (anti_aliased)
    {
        // Anti-aliased Fill
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count-2)*3 + points_count*6;
        const int vtx_count = (points_count*2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx+1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+((i-1)<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx+(i<<1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * sizeof(ImVec2));
        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            ImVec2 diff = p1 - p0;
            diff *= ImInvLength(diff, 1.0f);
            temp_normals[i0].x = diff.y;
            temp_normals[i0].y = -diff.x;
        }

        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            ImVec2 dm = (n0 + n1) * 0.5f;
            float dmr2 = dm.x*dm.x + dm.y*dm.y;
            if (dmr2 > 0.000001f)
            {
                float scale = 1.0f / dmr2;
                if (scale > 100.0f) scale = 100.0f;
                dm *= scale;
            }
            dm *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos = (points[i1] - dm); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos = (points[i1] + dm); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx+(i1<<1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+(i0<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx+(i0<<1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx+(i0<<1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx+(i1<<1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx+(i1<<1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count-2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+i-1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}